

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.hpp
# Opt level: O1

vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> * __thiscall
helics::TimeCoordinator::getDependents
          (vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
           *__return_storage_ptr__,TimeCoordinator *this)

{
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &(this->dependent_federates).m_mutex;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::vector
            (__return_storage_ptr__,&(this->dependent_federates).m_obj);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::vector<GlobalFederateId> getDependents() const
    {
        return *dependent_federates.lock_shared();
    }